

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv6Transmitter::AddToAcceptList(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  int iVar1;
  
  iVar1 = -0x72;
  if ((((this->init == true) && (iVar1 = -0x71, this->created == true)) &&
      (iVar1 = -0x6c, addr->addresstype == IPv6Address)) &&
     (iVar1 = -0x6a, this->receivemode == AcceptSome)) {
    iVar1 = ProcessAddAcceptIgnoreEntry
                      (this,(in6_addr)*(anon_union_16_3_a3f0114d_for___in6_u *)&addr->field_0xc,
                       *(uint16_t *)&addr[1].field_0xc);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::AddToAcceptList(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	if (receivemode != RTPTransmitter::AcceptSome)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_DIFFERENTRECEIVEMODE;
	}
	
	const RTPIPv6Address &address = (const RTPIPv6Address &)addr;
	status = ProcessAddAcceptIgnoreEntry(address.GetIP(),address.GetPort());

	MAINMUTEX_UNLOCK
	return status;
}